

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary.cpp
# Opt level: O1

void __thiscall CaDiCaL::Internal::ternary_idx(Internal *this,int idx,int64_t *steps,int64_t *htrs)

{
  pointer pFVar1;
  int iVar2;
  pointer pvVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  
  uVar9 = (ulong)(uint)-idx;
  if (0 < idx) {
    uVar9 = (ulong)(uint)idx;
  }
  if (((uint)(this->ftab).super__Vector_base<CaDiCaL::Flags,_std::allocator<CaDiCaL::Flags>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar9] & 0x7000400) == 0x1000400) {
    uVar4 = (int)uVar9 << 1 | (uint)idx >> 0x1f;
    pvVar3 = (this->otab).
             super__Vector_base<std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>,_std::allocator<std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = -idx;
    uVar7 = idx;
    if (idx < 1) {
      uVar7 = uVar6;
    }
    iVar2 = (this->opts).ternaryocclim;
    iVar5 = (int)((ulong)((long)*(pointer *)
                                 ((long)&pvVar3[uVar4].
                                         super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>
                                         ._M_impl.super__Vector_impl_data + 8) -
                         *(long *)&pvVar3[uVar4].
                                   super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>
                                   ._M_impl.super__Vector_impl_data) >> 3);
    if ((iVar5 <= iVar2) &&
       (uVar7 = uVar7 << 1 | uVar6 >> 0x1f,
       iVar8 = (int)((ulong)((long)*(pointer *)
                                    ((long)&pvVar3[uVar7].
                                            super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>
                                            ._M_impl.super__Vector_impl_data + 8) -
                            *(long *)&pvVar3[uVar7].
                                      super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>
                                      ._M_impl.super__Vector_impl_data) >> 3), iVar8 <= iVar2)) {
      if (iVar8 < iVar5) {
        idx = uVar6;
      }
      ternary_lit(this,idx,steps,htrs);
    }
    pFVar1 = (this->ftab).super__Vector_base<CaDiCaL::Flags,_std::allocator<CaDiCaL::Flags>_>.
             _M_impl.super__Vector_impl_data._M_start + uVar9;
    *pFVar1 = (Flags)((uint)*pFVar1 & 0xfffffbff);
  }
  return;
}

Assistant:

void Internal::ternary_idx (int idx, int64_t &steps, int64_t &htrs) {
  assert (0 < idx);
  assert (idx <= max_var);
  if (!active (idx))
    return;
  if (!flags (idx).ternary)
    return;
  int pos = occs (idx).size ();
  int neg = occs (-idx).size ();
  if (pos <= opts.ternaryocclim && neg <= opts.ternaryocclim) {
    LOG ("index %d has %zd positive and %zd negative occurrences", idx,
         occs (idx).size (), occs (-idx).size ());
    int pivot = (neg < pos ? -idx : idx);
    ternary_lit (pivot, steps, htrs);
  }
  flags (idx).ternary = false;
}